

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

void __thiscall
pbrt::PiecewiseLinear2D<2UL>::PiecewiseLinear2D(PiecewiseLinear2D<2UL> *this,Allocator alloc)

{
  int iVar1;
  polymorphic_allocator<std::byte> local_38;
  
  (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float> = (Tuple2<pbrt::Vector2,_float>)0x0;
  (this->m_size).super_Tuple2<pbrt::Vector2,_int> = (Tuple2<pbrt::Vector2,_int>)0x0;
  (this->m_patch_size).super_Tuple2<pbrt::Vector2,_float> = (Tuple2<pbrt::Vector2,_float>)0x0;
  (this->m_param_values).alloc.memoryResource = alloc.memoryResource;
  (this->m_param_values).ptr = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
  (this->m_param_values).nAlloc = 0;
  (this->m_param_values).nStored = 0;
  (this->m_data).alloc.memoryResource = alloc.memoryResource;
  (this->m_data).ptr = (float *)0x0;
  (this->m_data).nAlloc = 0;
  (this->m_data).nStored = 0;
  (this->m_marginal_cdf).alloc.memoryResource = alloc.memoryResource;
  (this->m_marginal_cdf).ptr = (float *)0x0;
  (this->m_marginal_cdf).nAlloc = 0;
  (this->m_marginal_cdf).nStored = 0;
  (this->m_conditional_cdf).alloc.memoryResource = alloc.memoryResource;
  (this->m_conditional_cdf).ptr = (float *)0x0;
  (this->m_conditional_cdf).nAlloc = 0;
  (this->m_conditional_cdf).nStored = 0;
  iVar1 = 1;
  local_38.memoryResource = alloc.memoryResource;
  do {
    pstd::
    vector<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pstd::pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>>
    ::emplace_back<pstd::pmr::polymorphic_allocator<std::byte>&>
              ((vector<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pstd::pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>>
                *)&this->m_param_values,&local_38);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  return;
}

Assistant:

PiecewiseLinear2D(Allocator alloc)
        : m_param_values(alloc),
          m_data(alloc),
          m_marginal_cdf(alloc),
          m_conditional_cdf(alloc) {
        for (int i = 0; i < ArraySize; ++i)
            m_param_values.emplace_back(alloc);
    }